

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O2

void __thiscall xs::ConnectionHandler::run(ConnectionHandler *this)

{
  (*(this->super_Thread)._vptr_Thread[3])();
  (*this->m_server->_vptr_TcpServer[4])(this->m_server,this);
  return;
}

Assistant:

void ConnectionHandler::run (void)
{
	try
	{
		handle();
	}
	catch (const std::exception& e)
	{
		printf("ConnectionHandler::run(): %s\n", e.what());
	}

	// Notify server that this connection is done.
	m_server->connectionDone(this);
}